

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  EXRChannelInfo *pEVar4;
  int *piVar5;
  EXRAttribute *pEVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  stringstream ss;
  undefined1 *local_1d0;
  undefined1 local_1c0 [16];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = (info->display_window).min_y;
  (exr_header->display_window).max_x = (info->display_window).max_x;
  (exr_header->display_window).max_y = (info->display_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = (info->data_window).min_y;
  (exr_header->data_window).max_x = (info->data_window).max_x;
  (exr_header->data_window).max_y = (info->data_window).max_y;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  exr_header->tiled = info->tiled;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = info->tile_size_y;
  exr_header->tile_level_mode = info->tile_level_mode;
  exr_header->tile_rounding_mode = info->tile_rounding_mode;
  EXRSetNameAttr(exr_header,(info->name)._M_dataplus._M_p);
  if ((info->type)._M_string_length != 0) {
    psVar1 = &info->type;
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      if (exr_header->tiled != 0) goto joined_r0x001c9f05;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 == 0) {
        iVar2 = exr_header->tiled;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar2 == 0) {
            exr_header->non_image = 1;
            if ((err != (string *)0x0) && (exr_header->tiled != 0)) {
              std::__cxx11::string::append((char *)err);
            }
          }
          else if (warn != (string *)0x0) {
            std::__cxx11::stringstream::stringstream(local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a0,"(ConvertHeader) Unsupported or unknown info.type: ",0x32);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a0,(info->type)._M_dataplus._M_p,
                                (info->type)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_append((char *)warn,(ulong)local_1d0);
            if (local_1d0 != local_1c0) {
              operator_delete(local_1d0);
            }
            std::__cxx11::stringstream::~stringstream(local_1b0);
            std::ios_base::~ios_base(local_130);
          }
          goto LAB_001c9f6d;
        }
        exr_header->non_image = 1;
        iVar2 = exr_header->tiled;
      }
      if (iVar2 == 0) {
joined_r0x001c9f05:
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
        return false;
      }
    }
  }
LAB_001c9f6d:
  iVar2 = (int)((long)(info->channels).
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(info->channels).
                      super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x49249249;
  exr_header->num_channels = iVar2;
  pEVar4 = (EXRChannelInfo *)malloc((long)iVar2 * 0x110);
  exr_header->channels = pEVar4;
  uVar7 = (ulong)exr_header->num_channels;
  if (uVar7 != 0) {
    lVar10 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      strncpy(exr_header->channels->name + lVar8,
              *(char **)(((info->channels).
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + -0x31),0xff);
      exr_header->channels->pad[lVar8 + -0xe] = '\0';
      *(undefined4 *)(exr_header->channels->pad + lVar8 + -0xd) =
           *(undefined4 *)
            (((info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xffffffffffffffef);
      exr_header->channels->pad[lVar8 + -1] =
           ((info->channels).
            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
            _M_impl.super__Vector_impl_data._M_start)->pad[lVar10 + 0xffffffffffffffff];
      *(undefined4 *)(exr_header->channels->pad + lVar8 + -9) =
           *(undefined4 *)
            (((info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xfffffffffffffff7);
      *(undefined4 *)(exr_header->channels->pad + lVar8 + -5) =
           *(undefined4 *)
            (((info->channels).
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->pad + lVar10 + 0xfffffffffffffffb);
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)exr_header->num_channels;
      lVar8 = lVar8 + 0x110;
      lVar10 = lVar10 + 0x38;
    } while (uVar9 < uVar7);
  }
  piVar5 = (int *)malloc(uVar7 << 2);
  exr_header->pixel_types = piVar5;
  uVar7 = (ulong)exr_header->num_channels;
  if (uVar7 != 0) {
    lVar8 = 8;
    uVar9 = 0;
    do {
      exr_header->pixel_types[uVar9] =
           *(int *)(((info->channels).
                     super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pad + lVar8 * 4 + -0x31);
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)exr_header->num_channels;
      lVar8 = lVar8 + 0xe;
    } while (uVar9 < uVar7);
  }
  piVar5 = (int *)malloc(uVar7 << 2);
  exr_header->requested_pixel_types = piVar5;
  if (exr_header->num_channels != 0) {
    lVar8 = 8;
    uVar7 = 0;
    do {
      exr_header->requested_pixel_types[uVar7] =
           *(int *)(((info->channels).
                     super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->pad + lVar8 * 4 + -0x31);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0xe;
    } while (uVar7 < (ulong)(long)exr_header->num_channels);
  }
  iVar2 = (int)((ulong)((long)(info->attributes).
                              super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(info->attributes).
                             super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4) * 0x3e0f83e1;
  exr_header->num_custom_attributes = iVar2;
  if (iVar2 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < iVar2) {
      exr_header->num_custom_attributes = 0x80;
    }
    iVar2 = exr_header->num_custom_attributes;
    pEVar6 = (EXRAttribute *)malloc((long)iVar2 * 0x210);
    exr_header->custom_attributes = pEVar6;
    if ((long)iVar2 != 0) {
      lVar8 = 0;
      uVar7 = 0;
      do {
        memcpy(exr_header->custom_attributes->name + lVar8,
               ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->name + lVar8,0x100);
        memcpy(exr_header->custom_attributes->type + lVar8,
               ((info->attributes).super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start)->type + lVar8,0x100);
        *(undefined4 *)((long)&exr_header->custom_attributes->size + lVar8) =
             *(undefined4 *)
              ((long)&((info->attributes).
                       super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                       super__Vector_impl_data._M_start)->size + lVar8);
        *(undefined8 *)((long)&exr_header->custom_attributes->value + lVar8) =
             *(undefined8 *)
              ((long)&((info->attributes).
                       super__Vector_base<TEXRAttribute,_std::allocator<TEXRAttribute>_>._M_impl.
                       super__Vector_impl_data._M_start)->value + lVar8);
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x210;
      } while (uVar7 < (ulong)(long)exr_header->num_custom_attributes);
    }
  }
  exr_header->header_len = info->header_len;
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}